

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdSplat<wabt::interp::Simd<unsigned_int,(unsigned_char)4>,unsigned_int>
          (Thread *this)

{
  Simd<unsigned_int,_(unsigned_char)__x04_> value;
  uint *__first;
  uint *__last;
  uint local_24 [2];
  Simd<unsigned_int,_(unsigned_char)__x04_> result;
  uint val;
  Thread *this_local;
  
  unique0x100000c5 = this;
  result.v[2] = Pop<unsigned_int>(this);
  __first = std::begin<unsigned_int,4ul>((uint (*) [4])local_24);
  __last = std::end<unsigned_int,4ul>((uint (*) [4])local_24);
  std::fill<unsigned_int*,unsigned_int>(__first,__last,result.v + 2);
  value.v[2] = result.v[0];
  value.v[3] = result.v[1];
  value.v[0] = local_24[0];
  value.v[1] = local_24[1];
  Push<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdSplat() {
  auto val = Pop<T>();
  R result;
  std::fill(std::begin(result.v), std::end(result.v), val);
  Push(result);
  return RunResult::Ok;
}